

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
clear(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this)

{
  undefined8 *in_RDI;
  
  if (((*(byte *)(in_RDI + 10) & 1) == 0) && ((void *)*in_RDI != (void *)0x0)) {
    operator_delete__((void *)*in_RDI);
  }
  if ((void *)in_RDI[1] != (void *)0x0) {
    operator_delete__((void *)in_RDI[1]);
  }
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[3] = 0;
  in_RDI[2] = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  return;
}

Assistant:

void clear() {
    if (!no_delete_)
      delete [] array_;
    delete [] used_;
    array_ = 0;
    used_ = 0;
    alloc_size_ = 0;
    size_ = 0;
    no_delete_ = false;
  }